

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_test.cpp
# Opt level: O0

int main(void)

{
  iterator it_00;
  cake_iterator<false> first;
  cake_iterator<true> first_00;
  cake_iterator<false> first_01;
  cake_iterator<true> first_02;
  cake_iterator<true> first_03;
  cake_iterator<false> first_04;
  cake_iterator<false> first_05;
  cake_iterator<false> last;
  cake_iterator<true> last_00;
  cake_iterator<false> last_01;
  cake_iterator<true> last_02;
  cake_iterator<true> last_03;
  cake_iterator<false> last_04;
  cake_iterator<false> last_05;
  undefined1 uVar1;
  undefined7 in_stack_ffffffffffffe008;
  undefined1 in_stack_ffffffffffffe00f;
  SLNode<int> *local_1ff0 [2];
  SLNode<int> *local_1fe0;
  iterator local_1fd8;
  undefined1 local_1fc0 [8];
  skiplist<int,_std::less<int>_> yskip;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  iterator local_15a0;
  SLNode<int> *local_1588 [2];
  SLNode<int> *local_1578;
  const_reverse_iterator local_1570;
  undefined1 local_1558 [8];
  skiplist<int,_std::less<int>_> uskip;
  undefined8 uStack_b48;
  undefined8 local_b40;
  const_reverse_iterator local_b38;
  SLNode<int> *local_b20 [2];
  SLNode<int> *local_b10;
  const_iterator local_b08;
  iterator local_af0;
  undefined1 local_ad8 [24];
  iterator local_ac0;
  undefined1 auStack_aa8 [8];
  iterator it;
  undefined8 uStack_a88;
  undefined8 local_a80;
  reverse_iterator local_a78;
  SLNode<int> *local_a60 [2];
  SLNode<int> *local_a50;
  iterator local_a48;
  int local_a1c;
  undefined1 local_a18 [4];
  int i;
  skiplist<int,_std::less<int>_> iskip;
  
  iskip._2564_4_ = 0;
  skiplist<int,_std::less<int>_>::skiplist((skiplist<int,_std::less<int>_> *)local_a18);
  for (local_a1c = 0; local_a1c < 0x15; local_a1c = local_a1c + 1) {
    if (local_a1c % 2 == 0) {
      skiplist<int,_std::less<int>_>::insert
                ((skiplist<int,_std::less<int>_> *)local_a18,local_a1c + 2);
    }
    else {
      skiplist<int,_std::less<int>_>::insert
                ((skiplist<int,_std::less<int>_> *)local_a18,local_a1c % 7);
    }
  }
  operator<<((ostream *)&std::cout,(skiplist<int,_std::less<int>_> *)local_a18);
  std::operator<<((ostream *)&std::cout,"Forward iterator :\n");
  skiplist<int,_std::less<int>_>::begin(&local_a48,(skiplist<int,_std::less<int>_> *)local_a18);
  skiplist<int,_std::less<int>_>::end
            ((iterator *)local_a60,(skiplist<int,_std::less<int>_> *)local_a18);
  first._8_8_ = local_a48.node;
  first._0_8_ = local_a48._8_8_;
  first.node = local_a60[0];
  last._8_8_ = local_a50;
  last._0_8_ = local_a60[1];
  last.node._0_7_ = in_stack_ffffffffffffe008;
  last.node._7_1_ = in_stack_ffffffffffffe00f;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>(first,last);
  std::operator<<((ostream *)&std::cout,"Reverse iterator:\n");
  skiplist<int,_std::less<int>_>::rbegin(&local_a78,(skiplist<int,_std::less<int>_> *)local_a18);
  skiplist<int,_std::less<int>_>::rend
            ((reverse_iterator *)&it.node,(skiplist<int,_std::less<int>_> *)local_a18);
  first_00._8_8_ = local_a78.node;
  first_00._0_8_ = local_a78._8_8_;
  first_00.node = it.node;
  last_00._8_8_ = local_a80;
  last_00._0_8_ = uStack_a88;
  last_00.node._0_7_ = in_stack_ffffffffffffe008;
  last_00.node._7_1_ = in_stack_ffffffffffffe00f;
  display<skiplist<int,std::less<int>>::cake_iterator<true>>(first_00,last_00);
  std::operator<<((ostream *)&std::cout,"Erasing with iterators:\n");
  skiplist<int,_std::less<int>_>::find
            ((iterator *)auStack_aa8,(skiplist<int,_std::less<int>_> *)local_a18,3);
  std::end<skiplist<int,std::less<int>>>(&local_ac0,(skiplist<int,_std::less<int>_> *)local_a18);
  uVar1 = skiplist<int,_std::less<int>_>::cake_iterator<false>::operator!=
                    ((cake_iterator<false> *)auStack_aa8,&local_ac0);
  if ((bool)uVar1) {
    local_ad8._16_8_ = it._8_8_;
    local_ad8._0_8_ = auStack_aa8;
    local_ad8._8_4_ = it.node_count_;
    local_ad8._12_4_ = it.node_count_ref_;
    it_00._8_8_ = it._0_8_;
    it_00.node_count_ = auStack_aa8._0_4_;
    it_00.node_count_ref_ = auStack_aa8._4_4_;
    it_00.node = (SLNode<int> *)it._8_8_;
    skiplist<int,_std::less<int>_>::erase
              (&local_af0,(skiplist<int,_std::less<int>_> *)local_a18,it_00);
    std::operator<<((ostream *)&std::cout,"Erased (I think?) \n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"Something very wrong\n");
  }
  std::operator<<((ostream *)&std::cout,"Forward constant iterator :\n");
  skiplist<int,_std::less<int>_>::cbegin(&local_b08,(skiplist<int,_std::less<int>_> *)local_a18);
  skiplist<int,_std::less<int>_>::cend
            ((const_iterator *)local_b20,(skiplist<int,_std::less<int>_> *)local_a18);
  first_01._8_8_ = local_b08.node;
  first_01._0_8_ = local_b08._8_8_;
  first_01.node = local_b20[0];
  last_01._8_8_ = local_b10;
  last_01._0_8_ = local_b20[1];
  last_01.node._0_7_ = in_stack_ffffffffffffe008;
  last_01.node._7_1_ = uVar1;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>(first_01,last_01);
  std::operator<<((ostream *)&std::cout,"Reverse constant iterator:\n");
  skiplist<int,_std::less<int>_>::crbegin(&local_b38,(skiplist<int,_std::less<int>_> *)local_a18);
  skiplist<int,_std::less<int>_>::crend
            ((const_reverse_iterator *)&uskip.field_0xa00,
             (skiplist<int,_std::less<int>_> *)local_a18);
  first_02._8_8_ = local_b38.node;
  first_02._0_8_ = local_b38._8_8_;
  first_02.node = (SLNode<int> *)uskip._2560_8_;
  last_02._8_8_ = local_b40;
  last_02._0_8_ = uStack_b48;
  last_02.node._0_7_ = in_stack_ffffffffffffe008;
  last_02.node._7_1_ = uVar1;
  display<skiplist<int,std::less<int>>::cake_iterator<true>>(first_02,last_02);
  std::operator<<((ostream *)&std::cout,"\nENDL\n\n");
  std::operator<<((ostream *)&std::cout,"Creating a new skiplist with the copy constructor:\n");
  skiplist<int,_std::less<int>_>::skiplist
            ((skiplist<int,_std::less<int>_> *)local_1558,
             (skiplist<int,_std::less<int>_> *)local_a18);
  std::operator<<((ostream *)&std::cout,"Reverse constant iterator\n");
  skiplist<int,_std::less<int>_>::crbegin(&local_1570,(skiplist<int,_std::less<int>_> *)local_1558);
  skiplist<int,_std::less<int>_>::crend
            ((const_reverse_iterator *)local_1588,(skiplist<int,_std::less<int>_> *)local_1558);
  first_03._8_8_ = local_1570.node;
  first_03._0_8_ = local_1570._8_8_;
  first_03.node = local_1588[0];
  last_03._8_8_ = local_1578;
  last_03._0_8_ = local_1588[1];
  last_03.node._0_7_ = in_stack_ffffffffffffe008;
  last_03.node._7_1_ = uVar1;
  display<skiplist<int,std::less<int>>::cake_iterator<true>>(first_03,last_03);
  std::operator<<((ostream *)&std::cout,"Deleting elements - 0 20 22\n");
  skiplist<int,_std::less<int>_>::erase((skiplist<int,_std::less<int>_> *)local_1558,0x14);
  skiplist<int,_std::less<int>_>::erase((skiplist<int,_std::less<int>_> *)local_1558,0);
  skiplist<int,_std::less<int>_>::erase((skiplist<int,_std::less<int>_> *)local_1558,0x16);
  std::operator<<((ostream *)&std::cout,"Forward iterator :\n");
  skiplist<int,_std::less<int>_>::begin(&local_15a0,(skiplist<int,_std::less<int>_> *)local_1558);
  skiplist<int,_std::less<int>_>::end
            ((iterator *)&yskip.field_0xa00,(skiplist<int,_std::less<int>_> *)local_1558);
  first_04._8_8_ = local_15a0.node;
  first_04._0_8_ = local_15a0._8_8_;
  first_04.node = (SLNode<int> *)yskip._2560_8_;
  last_04._8_8_ = local_15a8;
  last_04._0_8_ = uStack_15b0;
  last_04.node._0_7_ = in_stack_ffffffffffffe008;
  last_04.node._7_1_ = uVar1;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>(first_04,last_04);
  std::operator<<((ostream *)&std::cout,"\nENDL\n\n");
  std::operator<<((ostream *)&std::cout,
                  "Creating a new skiplist with the copy assignment operator:\n");
  skiplist<int,_std::less<int>_>::skiplist
            ((skiplist<int,_std::less<int>_> *)local_1fc0,
             (skiplist<int,_std::less<int>_> *)local_1558);
  std::operator<<((ostream *)&std::cout,"Forward iterator :\n");
  skiplist<int,_std::less<int>_>::begin(&local_1fd8,(skiplist<int,_std::less<int>_> *)local_1fc0);
  skiplist<int,_std::less<int>_>::end
            ((iterator *)local_1ff0,(skiplist<int,_std::less<int>_> *)local_1fc0);
  first_05._8_8_ = local_1fd8.node;
  first_05._0_8_ = local_1fd8._8_8_;
  first_05.node = local_1ff0[0];
  last_05._8_8_ = local_1fe0;
  last_05._0_8_ = local_1ff0[1];
  last_05.node._0_7_ = in_stack_ffffffffffffe008;
  last_05.node._7_1_ = uVar1;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>(first_05,last_05);
  skiplist<int,_std::less<int>_>::~skiplist((skiplist<int,_std::less<int>_> *)local_1fc0);
  skiplist<int,_std::less<int>_>::~skiplist((skiplist<int,_std::less<int>_> *)local_1558);
  skiplist<int,_std::less<int>_>::~skiplist((skiplist<int,_std::less<int>_> *)local_a18);
  return iskip._2564_4_;
}

Assistant:

int main() {
    skiplist<int> iskip;
    for(int i=0; i<21; i++)
    {
        if(i%2)
            iskip.insert(i%7);
        else
            iskip.insert(i+2);
    }
    std::cout << iskip;

    std::cout << "Forward iterator :\n";
    display(iskip.begin(), iskip.end());

    std::cout << "Reverse iterator:\n";
    display(iskip.rbegin(), iskip.rend());

    std::cout << "Erasing with iterators:\n";
    auto it = iskip.find(3);
    if(it != std::end(iskip)) {
        iskip.erase(it);
        std::cout << "Erased (I think?) \n";
    }
    else
        std::cout << "Something very wrong\n";

    std::cout << "Forward constant iterator :\n";
    display(iskip.cbegin(), iskip.cend());

    std::cout << "Reverse constant iterator:\n";
    display(iskip.crbegin(), iskip.crend());

    std::cout << "\nENDL\n\n";
    std::cout << "Creating a new skiplist with the copy constructor:\n";

    skiplist<int> uskip(iskip);
    std::cout << "Reverse constant iterator\n";
    display(uskip.crbegin(), uskip.crend());
    std::cout << "Deleting elements - 0 20 22\n";
    uskip.erase(20);
    uskip.erase(0);
    uskip.erase(22);
    std::cout << "Forward iterator :\n";
    display(uskip.begin(), uskip.end());

    std::cout << "\nENDL\n\n";
    std::cout << "Creating a new skiplist with the copy assignment operator:\n";

    skiplist<int> yskip = uskip;
    std::cout << "Forward iterator :\n";
    display(yskip.begin(), yskip.end());
}